

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O0

ON_Brep * ON_BrepCone(ON_Cone *cone,bool bCapBase,ON_Brep *pBrep)

{
  double r;
  ON_RevSurface *pRevSurface;
  ON_Brep *brep;
  ON_Brep *pOStack_20;
  bool bArcLengthParameterization;
  ON_Brep *pBrep_local;
  ON_Cone *pOStack_10;
  bool bCapBase_local;
  ON_Cone *cone_local;
  
  brep._7_1_ = 1;
  pRevSurface = (ON_RevSurface *)0x0;
  pOStack_20 = pBrep;
  pBrep_local._7_1_ = bCapBase;
  pOStack_10 = cone;
  if (pBrep != (ON_Brep *)0x0) {
    ON_Brep::Destroy(pBrep);
  }
  r = (double)ON_Cone::RevSurfaceForm(pOStack_10,(ON_RevSurface *)0x0);
  if ((ON_RevSurface *)r != (ON_RevSurface *)0x0) {
    if ((brep._7_1_ & 1) != 0) {
      (*(((ON_RevSurface *)r)->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object
        [0x25])(r,0);
    }
    pRevSurface = (ON_RevSurface *)
                  ON_BrepRevSurface((ON_RevSurface **)&r,(bool)(pBrep_local._7_1_ & 1),
                                    (bool)(pBrep_local._7_1_ & 1),pOStack_20);
    if (((ON_Brep *)pRevSurface == (ON_Brep *)0x0) && (r != 0.0)) {
      (**(code **)(*(long *)r + 0x20))();
    }
  }
  return (ON_Brep *)pRevSurface;
}

Assistant:

ON_Brep* ON_BrepCone( const ON_Cone& cone, bool bCapBase, ON_Brep* pBrep )
{
  bool bArcLengthParameterization = true;
  ON_Brep* brep = nullptr;
  if ( pBrep )
    pBrep->Destroy();
  ON_RevSurface* pRevSurface = cone.RevSurfaceForm();
  if ( pRevSurface )
  {
    if ( bArcLengthParameterization )
    {
      double r = fabs(cone.radius);
      if ( r <= ON_SQRT_EPSILON )
        r = 1.0;
      pRevSurface->SetDomain(0,0.0,2.0*ON_PI*r);
    }
    brep = ON_BrepRevSurface( pRevSurface, bCapBase, bCapBase, pBrep );
    if ( !brep )
      delete pRevSurface;
  }
  return brep;
}